

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool __thiscall cmFindPackageCommand::FindModule(cmFindPackageCommand *this,bool *found)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  PolicyStatus PVar3;
  iterator iVar4;
  PolicyID id;
  string_view value;
  bool system;
  string var;
  string debugBuffer;
  string foundVar;
  string mfile;
  cmAlphaNum local_d0;
  cmAlphaNum local_a0;
  string moduleFileName;
  string local_50;
  
  local_a0.View_._M_len = 4;
  local_a0.View_._M_str = "Find";
  local_d0.View_._M_str = (this->Name)._M_dataplus._M_p;
  local_d0.View_._M_len = (this->Name)._M_string_length;
  cmStrCat<char[7]>(&moduleFileName,&local_a0,&local_d0,(char (*) [7])0x59b26f);
  system = false;
  local_a0.View_._M_len = 0x30;
  local_a0.View_._M_str = "find_package considered the following paths for ";
  local_d0.View_._M_len = moduleFileName._M_string_length;
  local_d0.View_._M_str = moduleFileName._M_dataplus._M_p;
  cmStrCat<char[3]>(&debugBuffer,&local_a0,&local_d0,(char (*) [3])0x5983ae);
  cmMakefile::GetModulesFile
            (&mfile,(this->super_cmFindCommon).Makefile,&moduleFileName,&system,
             (this->super_cmFindCommon).DebugMode,&debugBuffer);
  if ((this->super_cmFindCommon).DebugMode == true) {
    if (mfile._M_string_length == 0) {
      local_a0.View_._M_len = debugBuffer._M_string_length;
      local_a0.View_._M_str = debugBuffer._M_dataplus._M_p;
      local_d0.View_._M_len = 0x18;
      local_d0.View_._M_str = "The file was not found.\n";
      cmStrCat<>(&var,&local_a0,&local_d0);
    }
    else {
      local_a0.View_._M_len = debugBuffer._M_string_length;
      local_a0.View_._M_str = debugBuffer._M_dataplus._M_p;
      local_d0.View_._M_len = 0x18;
      local_d0.View_._M_str = "The file was found at\n  ";
      cmStrCat<std::__cxx11::string,char[2]>(&var,&local_a0,&local_d0,&mfile,(char (*) [2])0x5c20d8)
      ;
    }
    std::__cxx11::string::operator=((string *)&debugBuffer,(string *)&var);
    std::__cxx11::string::~string((string *)&var);
    local_a0.View_._M_str = (this->DebugBuffer)._M_dataplus._M_p;
    local_a0.View_._M_len = (this->DebugBuffer)._M_string_length;
    local_d0.View_._M_len = debugBuffer._M_string_length;
    local_d0.View_._M_str = debugBuffer._M_dataplus._M_p;
    cmStrCat<>(&var,&local_a0,&local_d0);
    std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&var);
    std::__cxx11::string::~string((string *)&var);
  }
  bVar1 = true;
  if (mfile._M_string_length != 0) {
    if (system == true) {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::find(&(this->DeprecatedFindModules)._M_t,&this->Name);
      if ((_Rb_tree_header *)iVar4._M_node !=
          &(this->DeprecatedFindModules)._M_t._M_impl.super__Rb_tree_header) {
        PVar3 = cmMakefile::GetPolicyStatus
                          ((this->super_cmFindCommon).Makefile,iVar4._M_node[2]._M_color,false);
        if (PVar3 - NEW < 3) goto LAB_00231c92;
        if (PVar3 == WARN) {
          this_00 = (this->super_cmFindCommon).Makefile;
          cmPolicies::GetPolicyWarning_abi_cxx11_
                    (&foundVar,(cmPolicies *)(ulong)iVar4._M_node[2]._M_color,id);
          local_a0.View_._M_len = foundVar._M_string_length;
          local_a0.View_._M_str = foundVar._M_dataplus._M_p;
          local_d0.View_._M_len = 1;
          local_d0.View_._M_str = "\n";
          cmStrCat<>(&var,&local_a0,&local_d0);
          cmMakefile::IssueMessage(this_00,AUTHOR_WARNING,&var);
          std::__cxx11::string::~string((string *)&var);
          std::__cxx11::string::~string((string *)&foundVar);
        }
      }
    }
    *found = true;
    local_a0.View_._M_str = (this->Name)._M_dataplus._M_p;
    local_a0.View_._M_len = (this->Name)._M_string_length;
    local_d0.View_._M_len = 0xc;
    local_d0.View_._M_str = "_FIND_MODULE";
    cmStrCat<>(&var,&local_a0,&local_d0);
    value._M_str = "1";
    value._M_len = 1;
    cmMakefile::AddDefinition((this->super_cmFindCommon).Makefile,&var,value);
    bVar1 = ReadListFile(this,&mfile,DoPolicyScope);
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).Makefile,&var);
    if ((this->super_cmFindCommon).DebugMode == true) {
      local_a0.View_._M_str = (this->Name)._M_dataplus._M_p;
      local_a0.View_._M_len = (this->Name)._M_string_length;
      local_d0.View_._M_len = 6;
      local_d0.View_._M_str = "_FOUND";
      cmStrCat<>(&foundVar,&local_a0,&local_d0);
      bVar2 = cmMakefile::IsDefinitionSet((this->super_cmFindCommon).Makefile,&foundVar);
      if (bVar2) {
        bVar2 = cmMakefile::IsOn((this->super_cmFindCommon).Makefile,&foundVar);
        if (!bVar2) {
          local_a0.View_._M_str = (this->DebugBuffer)._M_dataplus._M_p;
          local_a0.View_._M_len = (this->DebugBuffer)._M_string_length;
          local_d0.View_._M_len = 0x2a;
          local_d0.View_._M_str = "The module is considered not found due to ";
          cmStrCat<std::__cxx11::string,char[14]>
                    (&local_50,&local_a0,&local_d0,&foundVar,(char (*) [14])" being FALSE.");
          std::__cxx11::string::operator=((string *)&this->DebugBuffer,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      std::__cxx11::string::~string((string *)&foundVar);
    }
    std::__cxx11::string::~string((string *)&var);
  }
LAB_00231c92:
  std::__cxx11::string::~string((string *)&mfile);
  std::__cxx11::string::~string((string *)&debugBuffer);
  std::__cxx11::string::~string((string *)&moduleFileName);
  return bVar1;
}

Assistant:

bool cmFindPackageCommand::FindModule(bool& found)
{
  std::string moduleFileName = cmStrCat("Find", this->Name, ".cmake");

  bool system = false;
  std::string debugBuffer = cmStrCat(
    "find_package considered the following paths for ", moduleFileName, ":\n");
  std::string mfile = this->Makefile->GetModulesFile(
    moduleFileName, system, this->DebugMode, debugBuffer);
  if (this->DebugMode) {
    if (mfile.empty()) {
      debugBuffer = cmStrCat(debugBuffer, "The file was not found.\n");
    } else {
      debugBuffer =
        cmStrCat(debugBuffer, "The file was found at\n  ", mfile, "\n");
    }
    this->DebugBuffer = cmStrCat(this->DebugBuffer, debugBuffer);
  }

  if (!mfile.empty()) {
    if (system) {
      auto const it = this->DeprecatedFindModules.find(this->Name);
      if (it != this->DeprecatedFindModules.end()) {
        cmPolicies::PolicyStatus status =
          this->Makefile->GetPolicyStatus(it->second);
        switch (status) {
          case cmPolicies::WARN: {
            this->Makefile->IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(it->second), "\n"));
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            return true;
        }
      }
    }

    // Load the module we found, and set "<name>_FIND_MODULE" to true
    // while inside it.
    found = true;
    std::string const var = cmStrCat(this->Name, "_FIND_MODULE");
    this->Makefile->AddDefinition(var, "1");
    bool result = this->ReadListFile(mfile, DoPolicyScope);
    this->Makefile->RemoveDefinition(var);

    if (this->DebugMode) {
      std::string const foundVar = cmStrCat(this->Name, "_FOUND");
      if (this->Makefile->IsDefinitionSet(foundVar) &&
          !this->Makefile->IsOn(foundVar)) {

        this->DebugBuffer = cmStrCat(
          this->DebugBuffer, "The module is considered not found due to ",
          foundVar, " being FALSE.");
      }
    }
    return result;
  }
  return true;
}